

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

float tcu::computeBilinearSearchStepFromFloatLine(LookupPrecision *prec,ColorLine *line)

{
  ulong uVar1;
  int ndx;
  long lVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Vec4 minStep;
  
  auVar6._0_4_ = (line->p1).m_data[0] - (line->p0).m_data[0];
  auVar6._4_4_ = (line->p1).m_data[1] - (line->p0).m_data[1];
  auVar6._8_4_ = (line->p1).m_data[2] - (line->p0).m_data[2];
  auVar6._12_4_ = (line->p1).m_data[3] - (line->p0).m_data[3];
  uVar1 = CONCAT44(auVar6._4_4_,auVar6._0_4_);
  auVar4._0_8_ = uVar1 ^ 0x8000000080000000;
  auVar4._8_4_ = -auVar6._8_4_;
  auVar4._12_4_ = -auVar6._12_4_;
  auVar4 = maxps(auVar4,auVar6);
  auVar4 = divps(auVar4,*(undefined1 (*) [16])(prec->colorThreshold).m_data);
  auVar5._0_4_ = auVar4._0_4_ + (float)DAT_006257e0;
  auVar5._4_4_ = auVar4._4_4_ + DAT_006257e0._4_4_;
  auVar5._8_4_ = auVar4._8_4_ + DAT_006257e0._8_4_;
  auVar5._12_4_ = auVar4._12_4_ + DAT_006257e0._12_4_;
  auVar4 = divps(_DAT_006257e0,auVar5);
  lVar2 = 1;
  minStep.m_data[0] = auVar4._0_4_;
  do {
    uVar3 = -(uint)(minStep.m_data[0] <= minStep.m_data[lVar2]);
    minStep.m_data[0] =
         (float)((uint)minStep.m_data[0] & uVar3 | ~uVar3 & (uint)minStep.m_data[lVar2]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  if (minStep.m_data[0] <= 1.5258789e-05) {
    minStep.m_data[0] = 1.5258789e-05;
  }
  return minStep.m_data[0];
}

Assistant:

inline Vector<T, Size> operator- (const Vector<T, Size>& a, const Vector<T, Size>& b)
{
	Vector<T, Size> res;
	for (int i = 0; i < Size; i++)
		res.m_data[i] = a.m_data[i] - b.m_data[i];
	return res;
}